

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_algebraic.hpp
# Opt level: O0

Opers __thiscall
chaiscript::Operators::to_operator(Operators *this,string_view t_str,bool t_is_unary)

{
  uint32_t uVar1;
  uint32_t op_hash;
  bool t_is_unary_local;
  string_view t_str_local;
  
  uVar1 = utility::fnv1a::hash((fnv1a *)this,t_str);
  if (uVar1 == 0x8c0cd5e8) {
    t_str_local._M_str._4_4_ = assign_shift_left;
  }
  else if (uVar1 == 0x90c1016c) {
    t_str_local._M_str._4_4_ = assign_bitwise_and;
  }
  else if (uVar1 == 0x90c34003) {
    t_str_local._M_str._4_4_ = not_equal;
  }
  else if (uVar1 == 0x90f4dccf) {
    t_str_local._M_str._4_4_ = equals;
  }
  else if (uVar1 == 0x94f721b2) {
    t_str_local._M_str._4_4_ = less_than_equal;
  }
  else if (uVar1 == 0x95f72345) {
    t_str_local._M_str._4_4_ = shift_left;
  }
  else if (uVar1 == 0xdb0c1b01) {
    t_str_local._M_str._4_4_ = bitwise_xor;
  }
  else if (uVar1 == 0xf90c4a3b) {
    t_str_local._M_str._4_4_ = bitwise_or;
  }
  else if (uVar1 == 0xfb0c4d61) {
    t_str_local._M_str._4_4_ = bitwise_complement;
  }
  else if (uVar1 == 0xfedbf213) {
    t_str_local._M_str._4_4_ = pre_increment;
  }
  else if (uVar1 == 0x100edf74) {
    t_str_local._M_str._4_4_ = assign_bitwise_xor;
  }
  else if (uVar1 == 0x10b97c27) {
    t_str_local._M_str._4_4_ = assign_remainder;
  }
  else if (uVar1 == 0x10cd03df) {
    t_str_local._M_str._4_4_ = assign_difference;
  }
  else if (uVar1 == 0x10de4d00) {
    t_str_local._M_str._4_4_ = assign_product;
  }
  else if (uVar1 == 0x10fc6214) {
    t_str_local._M_str._4_4_ = greater_than_equal;
  }
  else if (uVar1 == 0x13fc66cd) {
    t_str_local._M_str._4_4_ = shift_right;
  }
  else if (uVar1 == 0x14588772) {
    t_str_local._M_str._4_4_ = assign_bitwise_or;
  }
  else if (uVar1 == 0x14dc14b5) {
    t_str_local._M_str._4_4_ = assign_sum;
  }
  else if (uVar1 == 0x200c87a0) {
    t_str_local._M_str._4_4_ = remainder;
  }
  else if (uVar1 == 0x20cd1d0f) {
    t_str_local._M_str._4_4_ = pre_decrement;
  }
  else if (uVar1 == 0x230c8c59) {
    t_str_local._M_str._4_4_ = bitwise_and;
  }
  else if (uVar1 == 0x280c9438) {
    t_str_local._M_str._4_4_ = difference;
    if (((undefined1  [16])t_str & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      t_str_local._M_str._4_4_ = unary_minus;
    }
  }
  else if (uVar1 == 0x2a0c975e) {
    t_str_local._M_str._4_4_ = quotient;
  }
  else if (uVar1 == 0x2e0c9daa) {
    t_str_local._M_str._4_4_ = sum;
    if (((undefined1  [16])t_str & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      t_str_local._M_str._4_4_ = unary_plus;
    }
  }
  else if (uVar1 == 0x2f0c9f3d) {
    t_str_local._M_str._4_4_ = product;
  }
  else if (uVar1 == 0x380cad68) {
    t_str_local._M_str._4_4_ = assign;
  }
  else if (uVar1 == 0x390caefb) {
    t_str_local._M_str._4_4_ = less_than;
  }
  else if (uVar1 == 0x3b0cb221) {
    t_str_local._M_str._4_4_ = greater_than;
  }
  else if (uVar1 == 0x66560bd0) {
    t_str_local._M_str._4_4_ = assign_shift_right;
  }
  else {
    t_str_local._M_str._4_4_ = invalid;
  }
  return t_str_local._M_str._4_4_;
}

Assistant:

constexpr static Opers to_operator(std::string_view t_str, bool t_is_unary = false) noexcept {
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4307)
#endif

      const auto op_hash = utility::hash(t_str);
      switch (op_hash) {
        case utility::hash("=="): {
          return Opers::equals;
        }
        case utility::hash("<"): {
          return Opers::less_than;
        }
        case utility::hash(">"): {
          return Opers::greater_than;
        }
        case utility::hash("<="): {
          return Opers::less_than_equal;
        }
        case utility::hash(">="): {
          return Opers::greater_than_equal;
        }
        case utility::hash("!="): {
          return Opers::not_equal;
        }
        case utility::hash("="): {
          return Opers::assign;
        }
        case utility::hash("++"): {
          return Opers::pre_increment;
        }
        case utility::hash("--"): {
          return Opers::pre_decrement;
        }
        case utility::hash("*="): {
          return Opers::assign_product;
        }
        case utility::hash("+="): {
          return Opers::assign_sum;
        }
        case utility::hash("-="): {
          return Opers::assign_difference;
        }
        case utility::hash("&="): {
          return Opers::assign_bitwise_and;
        }
        case utility::hash("|="): {
          return Opers::assign_bitwise_or;
        }
        case utility::hash("<<="): {
          return Opers::assign_shift_left;
        }
        case utility::hash(">>="): {
          return Opers::assign_shift_right;
        }
        case utility::hash("%="): {
          return Opers::assign_remainder;
        }
        case utility::hash("^="): {
          return Opers::assign_bitwise_xor;
        }
        case utility::hash("<<"): {
          return Opers::shift_left;
        }
        case utility::hash(">>"): {
          return Opers::shift_right;
        }
        case utility::hash("%"): {
          return Opers::remainder;
        }
        case utility::hash("&"): {
          return Opers::bitwise_and;
        }
        case utility::hash("|"): {
          return Opers::bitwise_or;
        }
        case utility::hash("^"): {
          return Opers::bitwise_xor;
        }
        case utility::hash("~"): {
          return Opers::bitwise_complement;
        }
        case utility::hash("+"): {
          return t_is_unary ? Opers::unary_plus : Opers::sum;
        }
        case utility::hash("-"): {
          return t_is_unary ? Opers::unary_minus : Opers::difference;
        }
        case utility::hash("/"): {
          return Opers::quotient;
        }
        case utility::hash("*"): {
          return Opers::product;
        }
        default: {
          return Opers::invalid;
        }
      }
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif
    }